

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ringbuffer.cpp
# Opt level: O0

ssize_t __thiscall RingbufferBase::read(RingbufferBase *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  void *pvStack_30;
  ma_result result;
  void *src;
  size_t bytesToRead;
  size_t sizeInBytes_local;
  void *data_local;
  RingbufferBase *this_local;
  
  sizeInBytes_local = CONCAT44(in_register_00000034,__fd);
  src = __buf;
  bytesToRead = (size_t)__buf;
  data_local = this;
  ma_rb_acquire_read(&this->mRingbuffer,(size_t *)&src,&stack0xffffffffffffffd0);
  memcpy((void *)sizeInBytes_local,pvStack_30,(size_t)src);
  ma_rb_commit_read(&this->mRingbuffer,(size_t)src);
  return (ssize_t)src;
}

Assistant:

size_t RingbufferBase::read(void *data, size_t sizeInBytes) {
    size_t bytesToRead = sizeInBytes;
    void *src;
    
    auto result = ma_rb_acquire_read(&mRingbuffer, &bytesToRead, &src);
    Q_ASSERT(result == MA_SUCCESS);

    memcpy(data, src, bytesToRead);
    
    result = ma_rb_commit_read(&mRingbuffer, bytesToRead);
    Q_ASSERT(result == MA_SUCCESS || result == MA_AT_END);
    
    Q_UNUSED(result)
    return bytesToRead;
}